

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

line_t_conflict * FindDestination(line_t_conflict *src,int tag)

{
  uint uVar1;
  undefined4 extraout_var;
  FLineIdIterator it;
  FLineIdIterator local_20;
  line_t_conflict *plVar2;
  
  if (tag != 0) {
    local_20.start = tagManager.IDHashFirst[tag & 0xff];
    local_20.searchtag = tag;
    do {
      uVar1 = FLineIdIterator::Next(&local_20);
      plVar2 = (line_t_conflict *)CONCAT44(extraout_var,uVar1);
      if ((int)uVar1 < 0) break;
      plVar2 = lines + uVar1;
    } while (plVar2 == src);
    if (-1 < (int)uVar1) {
      return plVar2;
    }
  }
  return (line_t_conflict *)0x0;
}

Assistant:

static line_t *FindDestination(line_t *src, int tag)
{
	if (tag)
	{
		int lineno = -1;
		FLineIdIterator it(tag);

		while ((lineno = it.Next()) >= 0)
		{
			if (&lines[lineno] != src)
			{
				return &lines[lineno];
			}
		}
	}
	return NULL;
}